

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O3

bool anon_unknown.dwarf_e60ea::checkPixels<Imath_3_2::half>
               (Array2D<Imath_3_2::half> *ph,int width,int height)

{
  float *pfVar1;
  char cVar2;
  uint uVar3;
  ostream *poVar4;
  long *plVar5;
  float fVar6;
  uint uVar7;
  half *phVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  float fVar15;
  
  if (0 < height) {
    phVar8 = ph->_data;
    lVar9 = 0;
    lVar12 = 0;
    uVar10 = 0;
    bVar14 = false;
    do {
      if (0 < width) {
        uVar11 = 0;
        do {
          iVar13 = ((int)lVar9 + (int)uVar11) % 0x801;
          fVar15 = (float)iVar13;
          fVar6 = ABS(fVar15);
          uVar3 = (uint)fVar15 >> 0x10 & 0x8000;
          if ((uint)fVar6 < 0x38800000) {
            if ((0x33000000 < (uint)fVar6) &&
               (uVar7 = (uint)fVar6 & 0x7fffff | 0x800000, cVar2 = (char)((uint)fVar6 >> 0x17),
               uVar3 = uVar3 | uVar7 >> (0x7eU - cVar2 & 0x1f),
               0x80000000 < uVar7 << (cVar2 + 0xa2U & 0x1f))) {
              uVar3 = uVar3 + 1;
            }
          }
          else if ((uint)fVar6 < 0x7f800000) {
            if ((uint)fVar6 < 0x477ff000) {
              uVar3 = (int)fVar6 + 0x8000fff + (uint)(((uint)fVar6 >> 0xd & 1) != 0) >> 0xd | uVar3;
            }
            else {
              uVar3 = uVar3 | 0x7c00;
            }
          }
          else {
            uVar3 = uVar3 | 0x7c00;
            if (fVar6 != INFINITY) {
              uVar7 = (uint)fVar6 >> 0xd & 0x3ff;
              uVar3 = uVar3 | uVar7 | (uint)(uVar7 == 0);
            }
          }
          fVar6 = *(float *)(_imath_half_to_float_table + (ulong)phVar8[uVar11]._h * 4);
          pfVar1 = (float *)(_imath_half_to_float_table + (ulong)(uVar3 & 0xffff) * 4);
          if ((fVar6 != *pfVar1) || (NAN(fVar6) || NAN(*pfVar1))) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value at ",9);
            poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
            poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)uVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
            poVar4 = (ostream *)
                     ::operator<<(poVar4,(half)*(uint16_t *)
                                                ((long)&ph->_data[uVar11]._h + lVar12 * ph->_sizeY))
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
            plVar5 = (long *)std::ostream::operator<<(poVar4,iVar13);
            std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
            std::ostream::put((char)plVar5);
            std::ostream::flush();
            std::ostream::flush();
            return bVar14;
          }
          uVar11 = uVar11 + 1;
        } while ((uint)width != uVar11);
      }
      bVar14 = height - 1 <= uVar10;
      uVar10 = uVar10 + 1;
      lVar12 = lVar12 + 2;
      lVar9 = lVar9 + (ulong)(uint)width;
      phVar8 = phVar8 + ph->_sizeY;
    } while (uVar10 != (uint)height);
  }
  return true;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}